

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O2

int __thiscall
cmakels::cmake_query::cmake_query::configure(cmake_query *this,path *cmake_query_build_dir)

{
  cmake *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string sStack_4b8;
  path cmake_cache_src;
  path dst;
  string local_448;
  ifstream in;
  ofstream out;
  
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            ((path *)&in,(char (*) [15])0x4284d0,auto_format);
  std::filesystem::__cxx11::operator/(&cmake_cache_src,&this->build_dir_,(path *)&in);
  std::filesystem::__cxx11::path::~path((path *)&in);
  std::filesystem::create_directories(cmake_query_build_dir);
  bVar1 = std::filesystem::exists(&cmake_cache_src);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
              ((path *)&in,(char (*) [15])0x4284d0,auto_format);
    std::filesystem::__cxx11::operator/(&dst,cmake_query_build_dir,(path *)&in);
    std::filesystem::__cxx11::path::~path((path *)&in);
    std::filesystem::__cxx11::path::string((string *)&out,&cmake_cache_src);
    std::ifstream::ifstream(&in,(string *)&out,_S_in);
    std::__cxx11::string::~string((string *)&out);
    std::filesystem::__cxx11::path::string(&sStack_4b8,&dst);
    std::ofstream::ofstream(&out,(string *)&sStack_4b8,_S_out);
    std::__cxx11::string::~string((string *)&sStack_4b8);
    std::filesystem::__cxx11::path::string(&sStack_4b8,&cmake_cache_src);
    std::filesystem::__cxx11::path::string(&local_448,&dst);
    support::stream_replace_all
              ((istream *)&in,&out.super_basic_ostream<char,_std::char_traits<char>_>,&sStack_4b8,
               &local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&sStack_4b8);
    std::ofstream::~ofstream(&out);
    std::ifstream::~ifstream(&in);
    std::filesystem::__cxx11::path::~path(&dst);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"No CMakeCache.txt was found at ");
    std::filesystem::__cxx11::path::string((string *)&in,&cmake_cache_src);
    poVar3 = std::operator<<(poVar3,(string *)&in);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&in);
  }
  this_00 = (this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::filesystem::__cxx11::path::string((string *)&in,cmake_query_build_dir);
  cmake::SetHomeOutputDirectory(this_00,(string *)&in);
  std::__cxx11::string::~string((string *)&in);
  _in = (pointer)0x0;
  iVar2 = cmake::Run((this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>
                     ._M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                     super__Head_base<0UL,_cmake_*,_false>._M_head_impl,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&in,false,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&in);
  std::filesystem::__cxx11::path::~path(&cmake_cache_src);
  return iVar2;
}

Assistant:

int cmake_query::configure(fs::path const &cmake_query_build_dir) {
  fs::path cmake_cache_src{build_dir_ / "CMakeCache.txt"};
  fs::create_directories(cmake_query_build_dir);
  if (fs::exists(cmake_cache_src)) {
    auto dst = cmake_query_build_dir / "CMakeCache.txt";
    copy_cmake_cache(cmake_cache_src, dst);
  } else {
    std::cerr << "No CMakeCache.txt was found at " << cmake_cache_src.string()
              << std::endl;
  }
  my_cmake->SetHomeOutputDirectory(cmake_query_build_dir.string());

  return my_cmake->Run(std::vector<std::string>{}, false, true);
}